

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::CreateEvaluationFileOutputs(cmLocalGenerator *this,string *config)

{
  pointer puVar1;
  vector<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  *pvVar2;
  unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>
  *geef;
  pointer puVar3;
  
  pvVar2 = cmMakefile::GetEvaluationFiles(this->Makefile);
  puVar1 = (pvVar2->
           super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (pvVar2->
                super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    cmGeneratorExpressionEvaluationFile::CreateOutputFile
              ((puVar3->_M_t).
               super___uniq_ptr_impl<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluationFile_*,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>
               .super__Head_base<0UL,_cmGeneratorExpressionEvaluationFile_*,_false>._M_head_impl,
               this,config);
  }
  return;
}

Assistant:

void cmLocalGenerator::CreateEvaluationFileOutputs(std::string const& config)
{
  for (const auto& geef : this->Makefile->GetEvaluationFiles()) {
    geef->CreateOutputFile(this, config);
  }
}